

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldEncodingSynapse.cpp
# Opt level: O0

void __thiscall
ReceptiveFieldEncodingSynapse::ReceptiveFieldEncodingSynapse
          (ReceptiveFieldEncodingSynapse *this,Population *n_from,Population *n_to)

{
  vector<Event_*,_std::allocator<Event_*>_> *pvVar1;
  ReceptiveFieldEncodingSynapse_param *this_00;
  Population *in_RSI;
  Population *in_RDI;
  ReceptiveFieldEncodingSynapse *unaff_retaddr;
  Population *n_from_00;
  
  n_from_00 = in_RDI;
  Synapse::Synapse((Synapse *)in_RDI);
  in_RDI->_vptr_Population = (_func_int **)&PTR_update_0018fcd8;
  pvVar1 = &in_RDI->output;
  this_00 = (ReceptiveFieldEncodingSynapse_param *)operator_new(0x28);
  ReceptiveFieldEncodingSynapse_param::ReceptiveFieldEncodingSynapse_param(this_00);
  (pvVar1->super__Vector_base<Event_*,_std::allocator<Event_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this_00;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)in_RDI);
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x16e4ca);
  initialize(unaff_retaddr,n_from_00,in_RSI);
  return;
}

Assistant:

ReceptiveFieldEncodingSynapse::ReceptiveFieldEncodingSynapse(Population* n_from, Population* n_to) : 
    param(new ReceptiveFieldEncodingSynapse_param)
{
    initialize(n_from, n_to);
}